

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O2

Float __thiscall pbrt::Disk::PDF(Disk *this,ShapeSampleContext *ctx,Vector3f *wi)

{
  int iVar1;
  ShapeIntersection *pSVar2;
  long in_FS_OFFSET;
  Float FVar3;
  type tVar4;
  float fVar5;
  undefined1 extraout_var [56];
  undefined1 auVar6 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  Vector3<float> VVar10;
  Point3f PVar11;
  Ray ray;
  optional<pbrt::ShapeIntersection> isect;
  Float local_198;
  Tuple3<pbrt::Point3,_float> local_180;
  Tuple3<pbrt::Point3,_float> local_170;
  Tuple3<pbrt::Vector3,_float> local_160;
  Ray local_150;
  optional<pbrt::ShapeIntersection> local_128;
  undefined1 auVar9 [56];
  
  ShapeSampleContext::SpawnRay(&local_150,ctx,wi);
  Intersect(&local_128,this,&local_150,INFINITY);
  if (PDF(pbrt::ShapeSampleContext_const&,pbrt::Vector3<float>const&)::reg == '\0') {
    iVar1 = __cxa_guard_acquire(&PDF(pbrt::ShapeSampleContext_const&,pbrt::Vector3<float>const&)::
                                 reg);
    if (iVar1 != 0) {
      StatRegisterer::StatRegisterer
                ((StatRegisterer *)
                 &PDF(pbrt::ShapeSampleContext_const&,pbrt::Vector3<float>const&)::reg,
                 const::{lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__,(PixelAccumFunc)0x0)
      ;
      __cxa_guard_release(&PDF(pbrt::ShapeSampleContext_const&,pbrt::Vector3<float>const&)::reg);
    }
  }
  *(long *)(in_FS_OFFSET + -0xf8) = *(long *)(in_FS_OFFSET + -0xf8) + 1;
  if (local_128.set == false) {
    *(long *)(in_FS_OFFSET + -0x100) = *(long *)(in_FS_OFFSET + -0x100) + 1;
    local_198 = 0.0;
  }
  else {
    FVar3 = Area(this);
    auVar9 = extraout_var;
    pSVar2 = pstd::optional<pbrt::ShapeIntersection>::value(&local_128);
    VVar10 = Tuple3<pbrt::Vector3,_float>::operator-(&wi->super_Tuple3<pbrt::Vector3,_float>);
    local_160.z = VVar10.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar6._0_8_ = VVar10.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar6._8_56_ = auVar9;
    local_160._0_8_ = vmovlps_avx(auVar6._0_16_);
    tVar4 = AbsDot<float>(&(pSVar2->intr).super_Interaction.n,(Vector3<float> *)&local_160);
    auVar9 = extraout_var_00;
    PVar11 = ShapeSampleContext::p(ctx);
    local_180.z = PVar11.super_Tuple3<pbrt::Point3,_float>.z;
    auVar7._0_8_ = PVar11.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar7._8_56_ = auVar9;
    local_180._0_8_ = vmovlps_avx(auVar7._0_16_);
    pSVar2 = pstd::optional<pbrt::ShapeIntersection>::value(&local_128);
    PVar11 = Interaction::p((Interaction *)pSVar2);
    local_170.z = PVar11.super_Tuple3<pbrt::Point3,_float>.z;
    auVar8._0_8_ = PVar11.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar8._8_56_ = auVar9;
    local_170._0_8_ = vmovlps_avx(auVar8._0_16_);
    fVar5 = DistanceSquared<float>((Point3<float> *)&local_180,(Point3<float> *)&local_170);
    fVar5 = (1.0 / FVar3) / (tVar4 / fVar5);
    local_198 = (Float)((uint)(ABS(fVar5) != INFINITY) * (int)fVar5);
  }
  pstd::optional<pbrt::ShapeIntersection>::~optional(&local_128);
  return local_198;
}

Assistant:

PBRT_CPU_GPU
    Float PDF(const ShapeSampleContext &ctx, const Vector3f &wi) const {
        // Intersect sample ray with shape geometry
        Ray ray = ctx.SpawnRay(wi);
        pstd::optional<ShapeIntersection> isect = Intersect(ray);
        CHECK_RARE(1e-6, !isect.has_value());
        if (!isect)
            return 0;

        // Compute PDF in solid angle measure from shape intersection point
        Float pdf = (1 / Area()) / (AbsDot(isect->intr.n, -wi) /
                                    DistanceSquared(ctx.p(), isect->intr.p()));
        if (IsInf(pdf))
            pdf = 0;

        return pdf;
    }